

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O3

UBool __thiscall
icu_63::Calendar::getImmediatePreviousZoneTransition
          (Calendar *this,UDate base,UDate *transitionTime,UErrorCode *status)

{
  int iVar1;
  BasicTimeZone *pBVar2;
  UDate UVar3;
  TimeZoneTransition trans;
  TimeZoneTransition local_40;
  
  pBVar2 = getBasicTimeZone(this);
  if (pBVar2 == (BasicTimeZone *)0x0) {
    *status = U_UNSUPPORTED_ERROR;
  }
  else {
    TimeZoneTransition::TimeZoneTransition(&local_40);
    iVar1 = (*(pBVar2->super_TimeZone).super_UObject._vptr_UObject[0xf])(base,pBVar2,1,&local_40);
    if ((char)iVar1 != '\0') {
      UVar3 = TimeZoneTransition::getTime(&local_40);
      *transitionTime = UVar3;
      TimeZoneTransition::~TimeZoneTransition(&local_40);
      return '\x01';
    }
    *status = U_INTERNAL_PROGRAM_ERROR;
    TimeZoneTransition::~TimeZoneTransition(&local_40);
  }
  return '\0';
}

Assistant:

UBool Calendar::getImmediatePreviousZoneTransition(UDate base, UDate *transitionTime, UErrorCode& status) const {
    BasicTimeZone *btz = getBasicTimeZone();
    if (btz) {
        TimeZoneTransition trans;
        UBool hasTransition = btz->getPreviousTransition(base, TRUE, trans);
        if (hasTransition) {
            *transitionTime = trans.getTime();
            return TRUE;
        } else {
            // Could not find any transitions.
            // Note: This should never happen.
            status = U_INTERNAL_PROGRAM_ERROR;
        }
    } else {
        // If not BasicTimeZone, return unsupported error for now.
        // TODO: We may support non-BasicTimeZone in future.
        status = U_UNSUPPORTED_ERROR;
    }
    return FALSE;
}